

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

Colourb Rml::InterpolateColour(Colourb c0,Colourb c1,float alpha)

{
  Colourb CVar1;
  Rml *v0;
  Colourf CVar2;
  Colour<float,_1,_false> c_00;
  Colourf c;
  Colourf c1f;
  Colourf c0f;
  float alpha_local;
  Colourb c1_local;
  Colourb c0_local;
  
  c1f.blue = (float)c0;
  CVar2 = ColourToLinearSpace(c0);
  unique0x10000024 = CVar2._0_8_;
  c.blue = (float)c1;
  CVar2 = ColourToLinearSpace(c1);
  c1f._0_8_ = CVar2._8_8_;
  unique0x1000002c = CVar2._0_8_;
  v0 = (Rml *)&c1f.alpha;
  c_00 = Mix<Rml::Colour<float,1,false>>
                   ((Colour<float,_1,_false> *)v0,(Colour<float,_1,_false> *)&c.alpha,alpha);
  c._0_8_ = c_00._8_8_;
  CVar1 = ColourFromLinearSpace(v0,c_00);
  return CVar1;
}

Assistant:

static Colourb InterpolateColour(Colourb c0, Colourb c1, float alpha)
{
	Colourf c0f = ColourToLinearSpace(c0);
	Colourf c1f = ColourToLinearSpace(c1);
	Colourf c = Mix(c0f, c1f, alpha);
	return ColourFromLinearSpace(c);
}